

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

CMConnection INT_CMinitiate_conn(CManager_conflict cm,attr_list attrs)

{
  int iVar1;
  CMConnection conn;
  
  if (cm->initialized == 0) {
    CMinitialize(cm);
  }
  iVar1 = CMtrace_val[2];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMConnectionVerbose);
  }
  if (iVar1 != 0) {
    fwrite("Doing CMinitiate_conn\n",0x16,1,(FILE *)cm->CMTrace_file);
  }
  conn = CMinternal_initiate_conn(cm,attrs);
  iVar1 = CMtrace_val[2];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMConnectionVerbose);
  }
  if (iVar1 != 0) {
    if (conn == (CMConnection)0x0) {
      fwrite("NULL\n",5,1,(FILE *)cm->CMTrace_file);
    }
    else {
      fdump_CMConnection(cm->CMTrace_file,conn);
    }
  }
  return conn;
}

Assistant:

CMConnection
 INT_CMinitiate_conn(CManager cm, attr_list attrs)
 {
     CMConnection conn;
     if (!cm->initialized) CMinitialize(cm);
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 fprintf(cm->CMTrace_file,"Doing CMinitiate_conn\n");
     }
     conn = CMinternal_initiate_conn(cm, attrs);
     if (CMtrace_on(cm, CMConnectionVerbose)) {
	 if (conn != NULL) {
	     fdump_CMConnection(cm->CMTrace_file, conn);
	 } else {
	     fprintf(cm->CMTrace_file, "NULL\n");
	 }
     }
     return conn;
 }